

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalBeginWriteTransaction(Wal *pWal)

{
  int iVar1;
  WalIndexHdr *__s2;
  Wal *in_RDI;
  int rc;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  Wal *pWal_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI->readOnly == '\0') {
    local_4 = walLockExclusive((Wal *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe8),
                               (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                               (int)in_stack_ffffffffffffffe0);
    if (local_4 == 0) {
      in_RDI->writeLock = '\x01';
      pWal_00 = (Wal *)&in_RDI->hdr;
      __s2 = walIndexHdr(in_RDI);
      iVar1 = memcmp(pWal_00,__s2,0x30);
      if (iVar1 != 0) {
        local_4 = 0x205;
      }
      if (local_4 != 0) {
        walUnlockExclusive(pWal_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
        in_RDI->writeLock = '\0';
      }
    }
  }
  else {
    local_4 = 8;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalBeginWriteTransaction(Wal *pWal){
  int rc;

#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  /* If the write-lock is already held, then it was obtained before the
  ** read-transaction was even opened, making this call a no-op.
  ** Return early. */
  if( pWal->writeLock ){
    assert( !memcmp(&pWal->hdr,(void *)walIndexHdr(pWal),sizeof(WalIndexHdr)) );
    return SQLITE_OK;
  }
#endif

  /* Cannot start a write transaction without first holding a read
  ** transaction. */
  assert( pWal->readLock>=0 );
  assert( pWal->writeLock==0 && pWal->iReCksum==0 );

  if( pWal->readOnly ){
    return SQLITE_READONLY;
  }

  /* Only one writer allowed at a time.  Get the write lock.  Return
  ** SQLITE_BUSY if unable.
  */
  rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1);
  if( rc ){
    return rc;
  }
  pWal->writeLock = 1;

  /* If another connection has written to the database file since the
  ** time the read transaction on this connection was started, then
  ** the write is disallowed.
  */
  SEH_TRY {
    if( memcmp(&pWal->hdr, (void *)walIndexHdr(pWal), sizeof(WalIndexHdr))!=0 ){
      rc = SQLITE_BUSY_SNAPSHOT;
    }
  }
  SEH_EXCEPT( rc = SQLITE_IOERR_IN_PAGE; )

  if( rc!=SQLITE_OK ){
    walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    pWal->writeLock = 0;
  }
  return rc;
}